

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

float cimg_library::CImg<float>::_cimg_lanczos(float x)

{
  float fVar1;
  double dVar2;
  double dVar3;
  undefined4 local_1c;
  float b;
  float a;
  float x_local;
  
  if ((x <= -2.0) || (2.0 <= x)) {
    a = 0.0;
  }
  else {
    fVar1 = x * 3.1415927;
    if ((x != 0.0) || (NAN(x))) {
      dVar2 = std::sin((double)(ulong)(uint)fVar1);
      dVar3 = std::sin((double)(ulong)(uint)(fVar1 * 0.5));
      local_1c = (SUB84(dVar2,0) * SUB84(dVar3,0)) / (fVar1 * fVar1 * 0.5);
    }
    else {
      local_1c = 1.0;
    }
    a = local_1c;
  }
  return a;
}

Assistant:

static float _cimg_lanczos(const float x) {
      if (x<=-2 || x>=2) return 0;
      const float a = (float)cimg::PI*x, b = 0.5f*a;
      return (float)(x?std::sin(a)*std::sin(b)/(a*b):1);
    }